

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  strpool_internal_entry_t *__src;
  strpool_internal_handle_t *__src_00;
  strpool_internal_block_t *psVar4;
  char *pcVar5;
  int i;
  int iVar6;
  uint uVar7;
  unsigned_long_long uVar8;
  ulong uVar9;
  strpool_internal_entry_t *psVar10;
  strpool_internal_hash_slot_t *psVar11;
  strpool_internal_handle_t *psVar12;
  char cVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong __n;
  int iVar21;
  char *data;
  int *piVar22;
  uint *puVar23;
  strpool_internal_hash_slot_t *__ptr;
  uint uVar24;
  ulong uVar25;
  int local_68;
  
  uVar8 = 0;
  if (0 < length && string != (char *)0x0) {
    uVar9 = (ulong)(uint)pool->block_count;
    if (pool->block_count < 1) {
      uVar9 = uVar8;
    }
    for (; __n = (ulong)(uint)length, uVar9 * 0x20 != uVar8; uVar8 = uVar8 + 0x20) {
      lVar17 = *(long *)((long)&pool->blocks->data + uVar8);
      if (((char *)(lVar17 + 8U) <= string) &&
         (string < (char *)(lVar17 + *(int *)((long)&pool->blocks->capacity + uVar8)))) {
        if ((*(int *)(string + -4) == length) &&
           ((string[__n] == '\0' && (uVar20 = *(uint *)(string + -8), uVar20 != 0))))
        goto LAB_00161dd9;
        break;
      }
    }
    if (pool->ignore_case == 0) {
      uVar20 = 0x1505;
      for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
        uVar20 = uVar20 * 0x21 ^ (int)string[uVar9];
      }
    }
    else {
      uVar20 = 0x1505;
      for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
        cVar1 = string[uVar9];
        cVar13 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar13 = cVar1;
        }
        uVar20 = (int)cVar13 ^ uVar20 * 0x21;
      }
    }
    uVar20 = uVar20 + (uVar20 == 0);
LAB_00161dd9:
    uVar7 = pool->hash_capacity;
    uVar24 = uVar7 - 1;
    uVar18 = uVar24 & uVar20;
    __ptr = pool->hash_table;
    iVar21 = __ptr[(int)uVar18].base_count;
    uVar15 = uVar18;
    uVar16 = uVar18;
    while (0 < iVar21) {
      uVar2 = __ptr[(int)uVar16].hash_key;
      if ((uVar2 == 0) && (__ptr[(int)uVar15].hash_key != 0)) {
        uVar15 = uVar16;
      }
      if (((uVar2 & uVar24) == uVar18) && (iVar21 = iVar21 + -1, uVar2 == uVar20)) {
        iVar3 = __ptr[(int)uVar16].entry_index;
        psVar10 = pool->entries;
        if (psVar10[iVar3].length == length) {
          if (pool->ignore_case == 0) {
            iVar6 = bcmp(psVar10[iVar3].data + 8,string,__n);
          }
          else {
            iVar6 = strncasecmp(psVar10[iVar3].data + 8,string,__n);
          }
          if (iVar6 == 0) {
            local_68 = psVar10[iVar3].handle_index;
            psVar12 = pool->handles + local_68;
            goto LAB_001622e9;
          }
        }
      }
      uVar16 = uVar16 + 1 & uVar24;
    }
    if ((int)((int)uVar7 / -3 + uVar7) <= pool->entry_count) {
      pool->hash_capacity = uVar7 * 2;
      psVar11 = (strpool_internal_hash_slot_t *)calloc(1,(long)(int)uVar7 * 0x18);
      pool->hash_table = psVar11;
      if (psVar11 == (strpool_internal_hash_slot_t *)0x0) {
        __assert_fail("( pool->hash_table ) && ( \"Allocation failed\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                      ,0x346,"void strpool_internal_expand_hash_table(strpool_t *)");
      }
      uVar15 = uVar7 * 2 - 1;
      uVar19 = 0;
      uVar9 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar9 = uVar19;
      }
      for (; uVar19 != uVar9; uVar19 = uVar19 + 1) {
        uVar7 = __ptr[uVar19].hash_key;
        if (uVar7 != 0) {
          uVar18 = uVar7 & uVar15;
          uVar16 = uVar18;
          while (psVar11[(int)uVar16].hash_key != 0) {
            uVar16 = uVar16 + 1 & uVar15;
          }
          psVar11[(int)uVar16].hash_key = uVar7;
          iVar3 = __ptr[uVar19].entry_index;
          psVar11[(int)uVar16].entry_index = iVar3;
          pool->entries[iVar3].hash_slot = uVar16;
          psVar11[(int)uVar18].base_count = psVar11[(int)uVar18].base_count + 1;
        }
      }
      free(__ptr);
      uVar7 = pool->hash_capacity;
      uVar16 = uVar7 - 1;
      uVar18 = uVar16 & uVar20;
      __ptr = pool->hash_table;
      uVar15 = uVar18;
      uVar24 = uVar18;
      for (; iVar21 != 0; iVar21 = iVar21 - (uint)((__ptr[lVar17].hash_key & uVar16) == uVar18)) {
        lVar17 = (long)(int)uVar24;
        if ((__ptr[lVar17].hash_key == 0) && (__ptr[(int)uVar15].hash_key != 0)) {
          uVar15 = uVar24;
        }
        uVar24 = uVar24 + 1 & uVar16;
      }
    }
    while (__ptr[(int)uVar15].hash_key != 0) {
      uVar15 = uVar15 + 1 & uVar7 - 1;
    }
    iVar21 = pool->entry_count;
    iVar3 = pool->entry_capacity;
    if (iVar3 <= iVar21) {
      pool->entry_capacity = iVar3 * 2;
      psVar10 = (strpool_internal_entry_t *)malloc((long)iVar3 << 6);
      if (psVar10 == (strpool_internal_entry_t *)0x0) {
        __assert_fail("( new_entries ) && ( \"Allocation failed\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                      ,0x363,"void strpool_internal_expand_entries(strpool_t *)");
      }
      __src = pool->entries;
      memcpy(psVar10,__src,(long)iVar21 << 5);
      free(__src);
      pool->entries = psVar10;
      __ptr = pool->hash_table;
      if (__ptr[(int)uVar15].hash_key != 0) goto LAB_00162325;
    }
    if ((pool->hash_capacity - 1U & uVar20) != uVar18) {
LAB_00162325:
      __assert_fail("( !pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot ) && ( \"Invalid slot\" )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x3f3,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
    }
    __ptr[(int)uVar15].hash_key = uVar20;
    iVar21 = pool->entry_count;
    __ptr[(int)uVar15].entry_index = iVar21;
    __ptr[(int)uVar18].base_count = __ptr[(int)uVar18].base_count + 1;
    local_68 = pool->handle_count;
    lVar17 = (long)local_68;
    iVar3 = pool->handle_capacity;
    if (local_68 < iVar3) {
      psVar12 = pool->handles;
      psVar12[lVar17].counter = 1;
      pool->handle_count = local_68 + 1;
      lVar14 = lVar17;
    }
    else {
      local_68 = pool->handle_freelist_head;
      lVar14 = (long)local_68;
      if (lVar14 < 0) {
        pool->handle_capacity = iVar3 * 2;
        psVar12 = (strpool_internal_handle_t *)malloc((long)iVar3 << 4);
        if (psVar12 == (strpool_internal_handle_t *)0x0) {
          __assert_fail("( new_handles ) && ( \"Allocation failed\" )",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                        ,0x36f,"void strpool_internal_expand_handles(strpool_t *)");
        }
        __src_00 = pool->handles;
        memcpy(psVar12,__src_00,lVar17 << 3);
        free(__src_00);
        pool->handles = psVar12;
        local_68 = pool->handle_count;
        lVar14 = (long)local_68;
        psVar12[lVar14].counter = 1;
        pool->handle_count = local_68 + 1;
        iVar21 = pool->entry_count;
      }
      else {
        psVar12 = pool->handles;
        iVar3 = psVar12[lVar14].entry_index;
        if (pool->handle_freelist_tail == local_68) {
          pool->handle_freelist_tail = iVar3;
        }
        pool->handle_freelist_head = iVar3;
      }
    }
    psVar12[lVar14].entry_index = iVar21;
    psVar10 = pool->entries + iVar21;
    pool->entry_count = iVar21 + 1;
    uVar7 = length + 9U;
    if ((int)(length + 9U) < pool->min_data_size) {
      uVar7 = pool->min_data_size;
    }
    uVar7 = strpool_internal_pow2ceil(uVar7);
    uVar19 = 0;
    uVar9 = (ulong)(uint)pool->block_count;
    if (pool->block_count < 1) {
      uVar9 = uVar19;
    }
    psVar4 = pool->blocks;
    for (; uVar19 != uVar9; uVar19 = uVar19 + 1) {
      piVar22 = &psVar4[uVar19].free_list;
      uVar25 = 0xffffffff;
      while( true ) {
        uVar16 = *piVar22;
        lVar17 = (long)(int)uVar16;
        if (lVar17 < 0) break;
        pcVar5 = psVar4[uVar19].data;
        puVar23 = (uint *)(pcVar5 + lVar17);
        uVar18 = *(uint *)(pcVar5 + lVar17);
        if ((int)uVar18 / 2 < (int)uVar7) {
          if ((int)uVar7 <= (int)uVar18) {
            uVar7 = uVar18;
            if ((int)uVar25 < 0) {
              psVar4[uVar19].free_list = puVar23[1];
            }
            else {
              *(uint *)(pcVar5 + uVar25 + 4) = puVar23[1];
            }
            goto LAB_0016228b;
          }
          break;
        }
        piVar22 = (int *)(puVar23 + 1);
        uVar25 = (ulong)uVar16;
      }
    }
    iVar21 = pool->current_block;
    puVar23 = (uint *)psVar4[iVar21].tail;
    if ((*(int *)&psVar4[iVar21].data - (int)puVar23) + psVar4[iVar21].capacity < (int)uVar7) {
      uVar16 = pool->block_size;
      if (pool->block_size < (int)uVar7) {
        uVar16 = uVar7;
      }
      iVar21 = strpool_internal_add_block(pool,uVar16);
      pool->current_block = iVar21;
      puVar23 = (uint *)pool->blocks[iVar21].tail;
      pool->blocks[iVar21].tail = (char *)((long)(int)uVar7 + (long)puVar23);
    }
    else {
      psVar4[iVar21].tail = (char *)((long)(int)uVar7 + (long)puVar23);
    }
LAB_0016228b:
    psVar10->hash_slot = uVar15;
    psVar10->handle_index = local_68;
    psVar10->data = (char *)puVar23;
    psVar10->size = uVar7;
    psVar10->length = length;
    psVar10->refcount = 0;
    *puVar23 = uVar20;
    puVar23[1] = length;
    memcpy(puVar23 + 2,string,__n);
    *(char *)((long)puVar23 + __n + 8) = '\0';
    psVar12 = pool->handles + lVar14;
LAB_001622e9:
    uVar8 = (long)(local_68 + 1) & pool->index_mask |
            ((long)psVar12->counter & pool->counter_mask) << ((byte)pool->counter_shift & 0x3f);
  }
  return uVar8;
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length <= 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0, "Invalid base count" );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot, "Invalid slot" );
    STRPOOL_ASSERT( hash, "Invalid hash" );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }